

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O0

void __thiscall
TPZFront<double>::SymbolicAddKel(TPZFront<double> *this,TPZVec<long> *destinationindex)

{
  int64_t iVar1;
  int64_t iVar2;
  TPZVec<long> *in_RSI;
  TPZFront<double> *in_RDI;
  int64_t aux;
  int64_t loop_limit;
  int64_t i;
  int iVar3;
  int64_t in_stack_ffffffffffffffc8;
  long local_18;
  
  iVar1 = TPZVec<long>::NElements(in_RSI);
  for (local_18 = 0; local_18 < iVar1; local_18 = local_18 + 1) {
    TPZVec<long>::operator[](in_RSI,local_18);
    Local(in_RDI,in_stack_ffffffffffffffc8);
    iVar2 = TPZVec<long>::NElements(&(in_RDI->fGlobal).super_TPZVec<long>);
    in_RDI->fFront = iVar2;
  }
  if (in_RDI->fFront < (long)in_RDI->fMaxFront) {
    iVar3 = in_RDI->fMaxFront;
  }
  else {
    iVar3 = (int)in_RDI->fFront;
  }
  in_RDI->fMaxFront = iVar3;
  return;
}

Assistant:

void TPZFront<TVar>::SymbolicAddKel(TPZVec < int64_t > & destinationindex)
{
	int64_t i, loop_limit, aux;
	loop_limit=destinationindex.NElements();
	for(i=0;i<loop_limit;i++){
		aux=destinationindex[i];
		Local(aux);
		fFront = fGlobal.NElements();
	}
	fMaxFront=(fFront<fMaxFront)?fMaxFront:fFront;
	
}